

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCommonBugsTests.cpp
# Opt level: O0

IterateResult __thiscall gl3cts::ReservedNamesTest::iterate(ReservedNamesTest *this)

{
  _shader_type shader_type;
  _language_feature language_feature;
  bool bVar1;
  int iVar2;
  GLuint GVar3;
  deUint32 dVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  reference paVar7;
  reference paVar8;
  reference pbVar9;
  char *invalid_name;
  TestLog *this_00;
  MessageBuilder *pMVar10;
  char *local_460;
  string local_370;
  string local_350;
  MessageBuilder local_330;
  string local_1b0;
  undefined4 local_18c;
  char *local_188;
  char *so_body_string_raw;
  string so_body_string;
  string current_invalid_name;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_138;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_130;
  const_iterator reserved_name_it;
  bool structAllowed;
  iterator iStack_120;
  _language_feature current_language_feature;
  __normal_iterator<gl3cts::ReservedNamesTest::_language_feature_*,_std::vector<gl3cts::ReservedNamesTest::_language_feature,_std::allocator<gl3cts::ReservedNamesTest::_language_feature>_>_>
  local_118;
  __normal_iterator<const_gl3cts::ReservedNamesTest::_language_feature_*,_std::vector<gl3cts::ReservedNamesTest::_language_feature,_std::allocator<gl3cts::ReservedNamesTest::_language_feature>_>_>
  local_110;
  const_iterator language_feature_it;
  iterator iStack_e8;
  _shader_type current_shader_type;
  __normal_iterator<gl3cts::ReservedNamesTest::_shader_type_*,_std::vector<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>_>
  local_e0;
  __normal_iterator<const_gl3cts::ReservedNamesTest::_shader_type_*,_std::vector<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>_>
  local_d8;
  const_iterator shader_type_it;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  deUint32 local_9c;
  ApiType local_98;
  deUint32 local_94;
  ApiType local_90;
  deUint32 local_8c;
  ApiType local_88;
  deUint32 local_78;
  ApiType local_74;
  undefined1 local_70 [8];
  vector<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
  shader_types;
  undefined1 local_50 [7];
  bool result;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  reserved_names;
  vector<gl3cts::ReservedNamesTest::_language_feature,_std::allocator<gl3cts::ReservedNamesTest::_language_feature>_>
  language_features;
  Functions *gl;
  ContextType context_type;
  GLint compile_status;
  ReservedNamesTest *this_local;
  long lVar6;
  
  gl._4_4_ = 1;
  _context_type = this;
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  gl._0_4_ = (*pRVar5->_vptr_RenderContext[2])();
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar5->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar2);
  std::
  vector<gl3cts::ReservedNamesTest::_language_feature,_std::allocator<gl3cts::ReservedNamesTest::_language_feature>_>
  ::vector((vector<gl3cts::ReservedNamesTest::_language_feature,_std::allocator<gl3cts::ReservedNamesTest::_language_feature>_>
            *)&reserved_names.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_50);
  shader_types.
  super__Vector_base<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
  std::
  vector<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
  ::vector((vector<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
            *)local_70);
  local_74.m_bits = (deUint32)gl;
  local_78 = (deUint32)glu::ApiType::core(4,2);
  bVar1 = glu::contextSupports((ContextType)local_74.m_bits,(ApiType)local_78);
  if (bVar1) {
    (**(code **)(lVar6 + 0x868))(0x92d5,&this->m_max_gs_acs);
    (**(code **)(lVar6 + 0x868))(0x92d3,&this->m_max_tc_acs);
    (**(code **)(lVar6 + 0x868))(0x92d4,&this->m_max_te_acs);
    (**(code **)(lVar6 + 0x868))(0x92d2,&this->m_max_vs_acs);
  }
  local_88.m_bits = (deUint32)gl;
  local_8c = (deUint32)glu::ApiType::core(4,3);
  bVar1 = glu::contextSupports((ContextType)local_88.m_bits,(ApiType)local_8c);
  if (bVar1) {
    (**(code **)(lVar6 + 0x868))(&DAT_000090da,&this->m_max_fs_ssbos);
    (**(code **)(lVar6 + 0x868))(0x90d7,&this->m_max_gs_ssbos);
    (**(code **)(lVar6 + 0x868))(0x90d8,&this->m_max_tc_ssbos);
    (**(code **)(lVar6 + 0x868))(0x90d9,&this->m_max_te_ssbos);
    (**(code **)(lVar6 + 0x868))(0x90d6,&this->m_max_vs_ssbos);
    dVar4 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar4,"glGetIntegerv() call(s) failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                    ,0x1507);
  }
  local_90.m_bits = (deUint32)gl;
  local_94 = (deUint32)glu::ApiType::core(4,0);
  bVar1 = glu::contextSupports((ContextType)local_90.m_bits,(ApiType)local_94);
  if (bVar1) {
    GVar3 = (**(code **)(lVar6 + 0x3f0))(0x8e88);
    this->m_so_ids[3] = GVar3;
    GVar3 = (**(code **)(lVar6 + 0x3f0))(0x8e87);
    this->m_so_ids[4] = GVar3;
  }
  local_98.m_bits = (deUint32)gl;
  local_9c = (deUint32)glu::ApiType::core(4,3);
  bVar1 = glu::contextSupports((ContextType)local_98.m_bits,(ApiType)local_9c);
  if (bVar1) {
    GVar3 = (**(code **)(lVar6 + 0x3f0))(0x91b9);
    this->m_so_ids[0] = GVar3;
  }
  GVar3 = (**(code **)(lVar6 + 0x3f0))(0x8b30);
  this->m_so_ids[1] = GVar3;
  GVar3 = (**(code **)(lVar6 + 0x3f0))(0x8dd9);
  this->m_so_ids[2] = GVar3;
  GVar3 = (**(code **)(lVar6 + 0x3f0))(0x8b31);
  this->m_so_ids[5] = GVar3;
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"glCreateShader() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                  ,0x151a);
  getReservedNames_abi_cxx11_(&local_b8,this);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_50,&local_b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b8);
  getSupportedShaderTypes
            ((vector<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
              *)&shader_type_it,this);
  std::
  vector<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
  ::operator=((vector<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
               *)local_70,
              (vector<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
               *)&shader_type_it);
  std::
  vector<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
  ::~vector((vector<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
             *)&shader_type_it);
  local_e0._M_current =
       (anon_enum_32 *)
       std::
       vector<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
       ::begin((vector<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
                *)local_70);
  __gnu_cxx::
  __normal_iterator<gl3cts::ReservedNamesTest::_shader_type_const*,std::vector<gl3cts::ReservedNamesTest::_shader_type,std::allocator<gl3cts::ReservedNamesTest::_shader_type>>>
  ::__normal_iterator<gl3cts::ReservedNamesTest::_shader_type*>
            ((__normal_iterator<gl3cts::ReservedNamesTest::_shader_type_const*,std::vector<gl3cts::ReservedNamesTest::_shader_type,std::allocator<gl3cts::ReservedNamesTest::_shader_type>>>
              *)&local_d8,&local_e0);
  while( true ) {
    iStack_e8 = std::
                vector<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
                ::end((vector<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
                       *)local_70);
    bVar1 = __gnu_cxx::operator!=(&local_d8,&stack0xffffffffffffff18);
    if (!bVar1) break;
    paVar7 = __gnu_cxx::
             __normal_iterator<const_gl3cts::ReservedNamesTest::_shader_type_*,_std::vector<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>_>
             ::operator*(&local_d8);
    shader_type = *paVar7;
    if (this->m_so_ids[shader_type] != 0) {
      getSupportedLanguageFeatures
                ((vector<gl3cts::ReservedNamesTest::_language_feature,_std::allocator<gl3cts::ReservedNamesTest::_language_feature>_>
                  *)&language_feature_it,this,shader_type);
      std::
      vector<gl3cts::ReservedNamesTest::_language_feature,_std::allocator<gl3cts::ReservedNamesTest::_language_feature>_>
      ::operator=((vector<gl3cts::ReservedNamesTest::_language_feature,_std::allocator<gl3cts::ReservedNamesTest::_language_feature>_>
                   *)&reserved_names.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                  (vector<gl3cts::ReservedNamesTest::_language_feature,_std::allocator<gl3cts::ReservedNamesTest::_language_feature>_>
                   *)&language_feature_it);
      std::
      vector<gl3cts::ReservedNamesTest::_language_feature,_std::allocator<gl3cts::ReservedNamesTest::_language_feature>_>
      ::~vector((vector<gl3cts::ReservedNamesTest::_language_feature,_std::allocator<gl3cts::ReservedNamesTest::_language_feature>_>
                 *)&language_feature_it);
      local_118._M_current =
           (anon_enum_32 *)
           std::
           vector<gl3cts::ReservedNamesTest::_language_feature,_std::allocator<gl3cts::ReservedNamesTest::_language_feature>_>
           ::begin((vector<gl3cts::ReservedNamesTest::_language_feature,_std::allocator<gl3cts::ReservedNamesTest::_language_feature>_>
                    *)&reserved_names.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
      __gnu_cxx::
      __normal_iterator<gl3cts::ReservedNamesTest::_language_feature_const*,std::vector<gl3cts::ReservedNamesTest::_language_feature,std::allocator<gl3cts::ReservedNamesTest::_language_feature>>>
      ::__normal_iterator<gl3cts::ReservedNamesTest::_language_feature*>
                ((__normal_iterator<gl3cts::ReservedNamesTest::_language_feature_const*,std::vector<gl3cts::ReservedNamesTest::_language_feature,std::allocator<gl3cts::ReservedNamesTest::_language_feature>>>
                  *)&local_110,&local_118);
      while( true ) {
        iStack_120 = std::
                     vector<gl3cts::ReservedNamesTest::_language_feature,_std::allocator<gl3cts::ReservedNamesTest::_language_feature>_>
                     ::end((vector<gl3cts::ReservedNamesTest::_language_feature,_std::allocator<gl3cts::ReservedNamesTest::_language_feature>_>
                            *)&reserved_names.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
        bVar1 = __gnu_cxx::operator!=(&local_110,&stack0xfffffffffffffee0);
        if (!bVar1) break;
        paVar8 = __gnu_cxx::
                 __normal_iterator<const_gl3cts::ReservedNamesTest::_language_feature_*,_std::vector<gl3cts::ReservedNamesTest::_language_feature,_std::allocator<gl3cts::ReservedNamesTest::_language_feature>_>_>
                 ::operator*(&local_110);
        reserved_name_it._M_current._4_4_ = *paVar8;
        reserved_name_it._M_current._3_1_ =
             isStructAllowed(this,shader_type,reserved_name_it._M_current._4_4_);
        local_138._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_50);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
        ::__normal_iterator<std::__cxx11::string*>
                  ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    *)&local_130,&local_138);
        while( true ) {
          current_invalid_name.field_2._8_8_ =
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_50);
          bVar1 = __gnu_cxx::operator!=
                            (&local_130,
                             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)((long)&current_invalid_name.field_2 + 8));
          if (!bVar1) break;
          pbVar9 = __gnu_cxx::
                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&local_130);
          std::__cxx11::string::string
                    ((string *)(so_body_string.field_2._M_local_buf + 8),(string *)pbVar9);
          std::__cxx11::string::string((string *)&so_body_string_raw);
          local_188 = (char *)0x0;
          if (((reserved_name_it._M_current._3_1_ & 1) == 0) ||
             (iVar2 = std::__cxx11::string::compare(so_body_string.field_2._M_local_buf + 8),
             iVar2 != 0)) {
            language_feature = reserved_name_it._M_current._4_4_;
            invalid_name = (char *)std::__cxx11::string::c_str();
            getShaderBody_abi_cxx11_(&local_1b0,this,shader_type,language_feature,invalid_name);
            std::__cxx11::string::operator=((string *)&so_body_string_raw,(string *)&local_1b0);
            std::__cxx11::string::~string((string *)&local_1b0);
            local_188 = (char *)std::__cxx11::string::c_str();
            (**(code **)(lVar6 + 0x12b8))(this->m_so_ids[shader_type],1,&local_188,0);
            dVar4 = (**(code **)(lVar6 + 0x800))();
            glu::checkError(dVar4,"glShaderSource() call failed.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                            ,0x154c);
            (**(code **)(lVar6 + 0x248))(this->m_so_ids[shader_type]);
            dVar4 = (**(code **)(lVar6 + 0x800))();
            glu::checkError(dVar4,"glCompileShader() call failed.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                            ,0x154f);
            (**(code **)(lVar6 + 0xa70))(this->m_so_ids[shader_type],0x8b81,(long)&gl + 4);
            dVar4 = (**(code **)(lVar6 + 0x800))();
            glu::checkError(dVar4,"glGetShaderiv() call failed.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                            ,0x1552);
            if (gl._4_4_ != 0) {
              this_00 = tcu::TestContext::getLog
                                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
              tcu::TestLog::operator<<
                        (&local_330,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
              pMVar10 = tcu::MessageBuilder::operator<<(&local_330,(char (*) [3])"A ");
              getLanguageFeatureName_abi_cxx11_(&local_350,this,reserved_name_it._M_current._4_4_);
              pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_350);
              pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [9])0x29f4e3b);
              pMVar10 = tcu::MessageBuilder::operator<<
                                  (pMVar10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)((long)&so_body_string.field_2 + 8));
              pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [2])0x29dc08e);
              pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [14])", defined in ");
              getShaderTypeName_abi_cxx11_(&local_370,this,shader_type);
              pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_370);
              pMVar10 = tcu::MessageBuilder::operator<<
                                  (pMVar10,(char (*) [92])
                                           ", was accepted by the compiler, which is prohibited by the spec. Offending source code:\n>>\n"
                                  );
              pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_188);
              pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [6])"\n<<\n\n");
              tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::string::~string((string *)&local_370);
              std::__cxx11::string::~string((string *)&local_350);
              tcu::MessageBuilder::~MessageBuilder(&local_330);
              shader_types.
              super__Vector_base<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
            }
            local_18c = 0;
          }
          else {
            local_18c = 10;
          }
          std::__cxx11::string::~string((string *)&so_body_string_raw);
          std::__cxx11::string::~string((string *)(so_body_string.field_2._M_local_buf + 8));
          __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&local_130);
        }
        __gnu_cxx::
        __normal_iterator<const_gl3cts::ReservedNamesTest::_language_feature_*,_std::vector<gl3cts::ReservedNamesTest::_language_feature,_std::allocator<gl3cts::ReservedNamesTest::_language_feature>_>_>
        ::operator++(&local_110);
      }
    }
    __gnu_cxx::
    __normal_iterator<const_gl3cts::ReservedNamesTest::_shader_type_*,_std::vector<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>_>
    ::operator++(&local_d8);
  }
  if ((shader_types.
       super__Vector_base<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
    local_460 = "Fail";
  }
  else {
    local_460 = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
             (uint)((shader_types.
                     super__Vector_base<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0),local_460);
  local_18c = 1;
  std::
  vector<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
  ::~vector((vector<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
             *)local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_50);
  std::
  vector<gl3cts::ReservedNamesTest::_language_feature,_std::allocator<gl3cts::ReservedNamesTest::_language_feature>_>
  ::~vector((vector<gl3cts::ReservedNamesTest::_language_feature,_std::allocator<gl3cts::ReservedNamesTest::_language_feature>_>
             *)&reserved_names.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult ReservedNamesTest::iterate()
{
	glw::GLint					   compile_status = GL_TRUE;
	glu::ContextType			   context_type   = m_context.getRenderContext().getType();
	const glw::Functions&		   gl			  = m_context.getRenderContext().getFunctions();
	std::vector<_language_feature> language_features;
	std::vector<std::string>	   reserved_names;
	bool						   result = true;
	std::vector<_shader_type>	  shader_types;

	/* Retrieve important GL constant values */
	if (glu::contextSupports(context_type, glu::ApiType::core(4, 2)))
	{
		gl.getIntegerv(GL_MAX_GEOMETRY_ATOMIC_COUNTERS, &m_max_gs_acs);
		gl.getIntegerv(GL_MAX_TESS_CONTROL_ATOMIC_COUNTERS, &m_max_tc_acs);
		gl.getIntegerv(GL_MAX_TESS_EVALUATION_ATOMIC_COUNTERS, &m_max_te_acs);
		gl.getIntegerv(GL_MAX_VERTEX_ATOMIC_COUNTERS, &m_max_vs_acs);
	}

	if (glu::contextSupports(context_type, glu::ApiType::core(4, 3)))
	{
		gl.getIntegerv(GL_MAX_FRAGMENT_SHADER_STORAGE_BLOCKS, &m_max_fs_ssbos);
		gl.getIntegerv(GL_MAX_GEOMETRY_SHADER_STORAGE_BLOCKS, &m_max_gs_ssbos);
		gl.getIntegerv(GL_MAX_TESS_CONTROL_SHADER_STORAGE_BLOCKS, &m_max_tc_ssbos);
		gl.getIntegerv(GL_MAX_TESS_EVALUATION_SHADER_STORAGE_BLOCKS, &m_max_te_ssbos);
		gl.getIntegerv(GL_MAX_VERTEX_SHADER_STORAGE_BLOCKS, &m_max_vs_ssbos);

		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() call(s) failed.");
	}

	/* Create the shader objects */
	if (glu::contextSupports(context_type, glu::ApiType::core(4, 0)))
	{
		m_so_ids[SHADER_TYPE_TESS_CONTROL]	= gl.createShader(GL_TESS_CONTROL_SHADER);
		m_so_ids[SHADER_TYPE_TESS_EVALUATION] = gl.createShader(GL_TESS_EVALUATION_SHADER);
	}

	if (glu::contextSupports(context_type, glu::ApiType::core(4, 3)))
	{
		m_so_ids[SHADER_TYPE_COMPUTE] = gl.createShader(GL_COMPUTE_SHADER);
	}

	m_so_ids[SHADER_TYPE_FRAGMENT] = gl.createShader(GL_FRAGMENT_SHADER);
	m_so_ids[SHADER_TYPE_GEOMETRY] = gl.createShader(GL_GEOMETRY_SHADER);
	m_so_ids[SHADER_TYPE_VERTEX]   = gl.createShader(GL_VERTEX_SHADER);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call failed.");

	/* Retrieve context version-specific data */
	reserved_names = getReservedNames();
	shader_types   = getSupportedShaderTypes();

	/* Iterate over all supported shader stages.. */
	for (std::vector<_shader_type>::const_iterator shader_type_it = shader_types.begin();
		 shader_type_it != shader_types.end(); ++shader_type_it)
	{
		_shader_type current_shader_type = *shader_type_it;

		if (m_so_ids[current_shader_type] == 0)
		{
			/* Skip stages not supported by the currently running context version. */
			continue;
		}

		language_features = getSupportedLanguageFeatures(current_shader_type);

		/* ..and all language features we can test for the running context */
		for (std::vector<_language_feature>::const_iterator language_feature_it = language_features.begin();
			 language_feature_it != language_features.end(); ++language_feature_it)
		{
			_language_feature current_language_feature = *language_feature_it;

			bool structAllowed = isStructAllowed(current_shader_type, current_language_feature);

			/* Finally, all the reserved names we need to test - loop over them at this point */
			for (std::vector<std::string>::const_iterator reserved_name_it = reserved_names.begin();
				 reserved_name_it != reserved_names.end(); ++reserved_name_it)
			{
				std::string current_invalid_name = *reserved_name_it;
				std::string so_body_string;
				const char* so_body_string_raw = NULL;

				// There are certain shader types that allow struct for in/out declarations
				if (structAllowed && current_invalid_name.compare("struct") == 0)
				{
					continue;
				}

				/* Form the shader body */
				so_body_string =
					getShaderBody(current_shader_type, current_language_feature, current_invalid_name.c_str());
				so_body_string_raw = so_body_string.c_str();

				/* Try to compile the shader */
				gl.shaderSource(m_so_ids[current_shader_type], 1, /* count */
								&so_body_string_raw, NULL);		  /* length */
				GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() call failed.");

				gl.compileShader(m_so_ids[current_shader_type]);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader() call failed.");

				gl.getShaderiv(m_so_ids[current_shader_type], GL_COMPILE_STATUS, &compile_status);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv() call failed.");

/* Left for the debugging purposes for those in need .. */
#if 0
				char temp[4096];

				gl.getShaderInfoLog(m_so_ids[current_shader_type],
					4096,
					NULL,
					temp);

				m_testCtx.getLog() << tcu::TestLog::Message
					<< "\n"
					"-----------------------------\n"
					"Shader:\n"
					">>\n"
					<< so_body_string_raw
					<< "\n<<\n"
					"\n"
					"Info log:\n"
					">>\n"
					<< temp
					<< "\n<<\n\n"
					<< tcu::TestLog::EndMessage;
#endif

				if (compile_status != GL_FALSE)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "A "
									   << getLanguageFeatureName(current_language_feature) << " named ["
									   << current_invalid_name << "]"
									   << ", defined in " << getShaderTypeName(current_shader_type)
									   << ", was accepted by the compiler, "
										  "which is prohibited by the spec. Offending source code:\n"
										  ">>\n"
									   << so_body_string_raw << "\n<<\n\n"
									   << tcu::TestLog::EndMessage;

					result = false;
				}

			} /* for (all reserved names for the current context) */
		}	 /* for (all language features supported by the context) */
	}		  /* for (all shader types supported by the context) */

	m_testCtx.setTestResult(result ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, result ? "Pass" : "Fail");

	return STOP;
}